

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.c
# Opt level: O2

int rt_input_size(rt_context_pointer context,size_t index)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = (long)*(int *)(*(long *)((long)context + 0x38) + index * 4) * 0x20;
  uVar1 = *(uint *)(*(long *)((long)context + 0x18) + lVar4);
  uVar5 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar5;
  }
  iVar2 = 1;
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    iVar2 = iVar2 * *(int *)(*(long *)(*(long *)((long)context + 0x18) + 8 + lVar4) + uVar5 * 4);
  }
  return iVar2;
}

Assistant:

int rt_input_size(rt_context_pointer context, size_t index) {
  int i; // Iterator

  rt_context_t *c = context;
  rt_variable_t v = c->variables[c->input_variable_ids[index]];

  int size = 1;
  for (i = 0; i < v.shape.size; i++) {
    size *= v.shape.data[i];
  }

  return size;
}